

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O0

void RDL_addEdge(RDL_graph *gra,uint from,uint to)

{
  RDL_edge *paRVar1;
  uint local_1c;
  uint i;
  uint to_local;
  uint from_local;
  RDL_graph *gra_local;
  
  if (from != to) {
    for (local_1c = 0; local_1c < gra->degree[from]; local_1c = local_1c + 1) {
      if (gra->adjList[from][local_1c][0] == to) {
        return;
      }
    }
    gra->E = gra->E + 1;
    gra->degree[from] = gra->degree[from] + 1;
    if (gra->degree[from] == 1) {
      paRVar1 = (RDL_edge *)malloc((ulong)gra->degree[from] << 3);
      gra->adjList[from] = paRVar1;
    }
    else {
      paRVar1 = (RDL_edge *)realloc(gra->adjList[from],(ulong)gra->degree[from] << 3);
      gra->adjList[from] = paRVar1;
    }
    gra->adjList[from][gra->degree[from] - 1][0] = to;
  }
  return;
}

Assistant:

void RDL_addEdge(RDL_graph *gra, unsigned from, unsigned to)
{
  unsigned i;

  /* loops */
  if (from == to) {
    return;
  }

  for(i=0; i<gra->degree[from]; ++i) {
    if(gra->adjList[from][i][0] == to) {
      /*edge already exists*/
      return;
    }
  }
  ++gra->E;
  ++gra->degree[from];
  if(gra->degree[from] == 1)/*was 0, has never been initialized*/
  {
    gra->adjList[from] = malloc(gra->degree[from] * sizeof(*gra->adjList[from]));
  }
  else
  {
    gra->adjList[from] = realloc(gra->adjList[from], gra->degree[from] *
                                 sizeof(*gra->adjList[from]));
  }
  gra->adjList[from][ gra->degree[from]-1 ][0] = to;
}